

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O1

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_arc
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,double x,double y,double dx1,double dy1,
          double dx2,double dy2)

{
  int iVar1;
  double dVar2;
  point_base<double> *ppVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_78;
  
  local_78 = atan2((double)this->m_width_sign * dy1,(double)this->m_width_sign * dx1);
  dVar7 = atan2((double)this->m_width_sign * dy2,(double)this->m_width_sign * dx2);
  dVar8 = acos(this->m_width_abs / (0.125 / this->m_approx_scale + this->m_width_abs));
  uVar6 = vc->m_size >> 6;
  if (vc->m_num_blocks <= uVar6) {
    pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar6);
  }
  ppVar3 = vc->m_blocks[uVar6];
  uVar6 = vc->m_size;
  uVar4 = (ulong)((uVar6 & 0x3f) << 4);
  *(double *)((long)&ppVar3->x + uVar4) = dx1 + x;
  *(double *)((long)&ppVar3->y + uVar4) = dy1 + y;
  vc->m_size = uVar6 + 1;
  if (this->m_width_sign < 1) {
    dVar7 = local_78 -
            (double)(~-(ulong)(local_78 < dVar7) & (ulong)dVar7 |
                    (ulong)(dVar7 + -6.283185307179586) & -(ulong)(local_78 < dVar7));
    iVar5 = (int)(dVar7 / (dVar8 + dVar8));
    if (0 < iVar5) {
      iVar1 = iVar5 + 1;
      do {
        local_78 = local_78 - dVar7 / (double)iVar1;
        dVar9 = cos(local_78);
        dVar8 = this->m_width;
        dVar10 = sin(local_78);
        dVar2 = this->m_width;
        uVar6 = vc->m_size >> 6;
        if (vc->m_num_blocks <= uVar6) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar6);
        }
        ppVar3 = vc->m_blocks[uVar6];
        uVar6 = vc->m_size;
        uVar4 = (ulong)((uVar6 & 0x3f) << 4);
        *(double *)((long)&ppVar3->x + uVar4) = dVar9 * dVar8 + x;
        *(double *)((long)&ppVar3->y + uVar4) = dVar10 * dVar2 + y;
        vc->m_size = uVar6 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
  }
  else {
    dVar7 = (double)(~-(ulong)(dVar7 < local_78) & (ulong)dVar7 |
                    (ulong)(dVar7 + 6.283185307179586) & -(ulong)(dVar7 < local_78)) - local_78;
    iVar5 = (int)(dVar7 / (dVar8 + dVar8));
    if (0 < iVar5) {
      iVar1 = iVar5 + 1;
      do {
        local_78 = local_78 + dVar7 / (double)iVar1;
        dVar9 = cos(local_78);
        dVar8 = this->m_width;
        dVar10 = sin(local_78);
        dVar2 = this->m_width;
        uVar6 = vc->m_size >> 6;
        if (vc->m_num_blocks <= uVar6) {
          pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar6);
        }
        ppVar3 = vc->m_blocks[uVar6];
        uVar6 = vc->m_size;
        uVar4 = (ulong)((uVar6 & 0x3f) << 4);
        *(double *)((long)&ppVar3->x + uVar4) = dVar9 * dVar8 + x;
        *(double *)((long)&ppVar3->y + uVar4) = dVar10 * dVar2 + y;
        vc->m_size = uVar6 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
  }
  uVar6 = vc->m_size >> 6;
  if (vc->m_num_blocks <= uVar6) {
    pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar6);
  }
  ppVar3 = vc->m_blocks[uVar6];
  uVar6 = vc->m_size;
  uVar4 = (ulong)((uVar6 & 0x3f) << 4);
  *(double *)((long)&ppVar3->x + uVar4) = x + dx2;
  *(double *)((long)&ppVar3->y + uVar4) = y + dy2;
  vc->m_size = uVar6 + 1;
  return;
}

Assistant:

void math_stroke<VC>::calc_arc(VC& vc,
                                   double x,   double y, 
                                   double dx1, double dy1, 
                                   double dx2, double dy2)
    {
        double a1 = atan2(dy1 * m_width_sign, dx1 * m_width_sign);
        double a2 = atan2(dy2 * m_width_sign, dx2 * m_width_sign);
        double da = a1 - a2;
        int i, n;

        da = acos(m_width_abs / (m_width_abs + 0.125 / m_approx_scale)) * 2;

        add_vertex(vc, x + dx1, y + dy1);
        if(m_width_sign > 0)
        {
            if(a1 > a2) a2 += 2 * pi;
            n = int((a2 - a1) / da);
            da = (a2 - a1) / (n + 1);
            a1 += da;
            for(i = 0; i < n; i++)
            {
                add_vertex(vc, x + cos(a1) * m_width, y + sin(a1) * m_width);
                a1 += da;
            }
        }
        else
        {
            if(a1 < a2) a2 -= 2 * pi;
            n = int((a1 - a2) / da);
            da = (a1 - a2) / (n + 1);
            a1 -= da;
            for(i = 0; i < n; i++)
            {
                add_vertex(vc, x + cos(a1) * m_width, y + sin(a1) * m_width);
                a1 -= da;
            }
        }
        add_vertex(vc, x + dx2, y + dy2);
    }